

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_reader_locate_file_v2
                  (mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags,mz_uint32 *pIndex)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  mz_zip_internal_state *pmVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  mz_zip_error mVar14;
  ulong __n;
  byte bVar15;
  void *__s2;
  ulong uVar16;
  int iVar17;
  byte *pbVar18;
  int iVar19;
  ulong uVar20;
  byte *pbVar21;
  byte bVar22;
  long lVar23;
  mz_zip_internal_state *pState;
  bool bVar24;
  bool bVar25;
  
  if (pIndex != (mz_uint32 *)0x0) {
    *pIndex = 0;
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar4 = pZip->m_pState;
  if (pName == (char *)0x0 || pmVar4 == (mz_zip_internal_state *)0x0) {
    mVar14 = MZ_ZIP_INVALID_PARAMETER;
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    goto LAB_0011af9c;
  }
  if (((((pmVar4->m_init_flags & 0x800) == 0) && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)) &&
      (pComment == (char *)0x0 && (flags & 0x300) == 0)) &&
     ((pmVar4->m_sorted_central_dir_offsets).m_size != 0)) {
    pvVar5 = (pmVar4->m_sorted_central_dir_offsets).m_p;
    uVar11 = pZip->m_total_files;
    sVar7 = strlen(pName);
    if (pIndex != (mz_uint32 *)0x0) {
      *pIndex = 0;
    }
    mVar14 = MZ_ZIP_FILE_NOT_FOUND;
    if ((ulong)uVar11 == 0) goto LAB_0011af9c;
    lVar10 = 0;
    lVar23 = (ulong)uVar11 - 1;
    while (lVar10 <= lVar23) {
      uVar12 = (lVar23 - lVar10 >> 1) + lVar10;
      uVar11 = *(uint *)((long)pvVar5 + (uVar12 & 0xffffffff) * 4);
      pvVar6 = (pmVar4->m_central_dir).m_p;
      uVar9 = (ulong)*(uint *)((long)(pmVar4->m_central_dir_offsets).m_p + (ulong)uVar11 * 4);
      pbVar18 = (byte *)((long)pvVar6 + uVar9 + 0x2e);
      uVar3 = *(ushort *)(pbVar18 + -0x12);
      uVar20 = (ulong)uVar3;
      if ((uint)sVar7 <= (uint)uVar3) {
        uVar20 = sVar7 & 0xffffffff;
      }
      pbVar1 = (byte *)((long)pvVar6 + uVar20 + 0x2e + uVar9);
      pbVar21 = (byte *)pName;
      if ((int)uVar20 == 0) {
        iVar19 = 0;
      }
      else {
        do {
          bVar2 = *pbVar18;
          bVar22 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar22 = bVar2;
          }
          bVar2 = *pbVar21;
          bVar15 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar15 = bVar2;
          }
          if (bVar22 != bVar15) break;
          pbVar18 = pbVar18 + 1;
          pbVar21 = pbVar21 + 1;
        } while (pbVar18 < pbVar1);
        iVar19 = (uint)bVar22 - (uint)bVar15;
      }
      if (pbVar18 == pbVar1) {
        iVar19 = (uint)uVar3 - (uint)sVar7;
      }
      lVar13 = lVar23;
      if (iVar19 == 0) {
        if (pIndex != (mz_uint32 *)0x0) {
          *pIndex = uVar11;
        }
      }
      else {
        lVar13 = uVar12 - 1;
        if (iVar19 < 0) {
          lVar10 = uVar12 + 1;
          lVar13 = lVar23;
        }
      }
      lVar23 = lVar13;
      if (iVar19 == 0) {
        return 1;
      }
    }
  }
  else {
    sVar7 = strlen(pName);
    mVar14 = MZ_ZIP_INVALID_PARAMETER;
    if (0xffff < sVar7) goto LAB_0011af9c;
    if (pComment == (char *)0x0) {
      sVar8 = 0;
    }
    else {
      sVar8 = strlen(pComment);
    }
    mVar14 = MZ_ZIP_INVALID_PARAMETER;
    if ((0xffff < sVar8) || (mVar14 = MZ_ZIP_FILE_NOT_FOUND, pZip->m_total_files == 0))
    goto LAB_0011af9c;
    pvVar5 = (pmVar4->m_central_dir).m_p;
    pvVar6 = (pmVar4->m_central_dir_offsets).m_p;
    uVar12 = 0;
    do {
      uVar20 = (ulong)*(uint *)((long)pvVar6 + uVar12 * 4);
      uVar3 = *(ushort *)((long)pvVar5 + uVar20 + 0x1c);
      uVar9 = (ulong)uVar3;
      bVar25 = false;
      if (sVar7 <= uVar9) {
        __s2 = (void *)((long)pvVar5 + uVar20 + 0x2e);
        if (sVar8 != 0) {
          __n = (ulong)*(ushort *)((long)pvVar5 + uVar20 + 0x20);
          if (sVar8 == __n) {
            uVar16 = (ulong)*(ushort *)((long)pvVar5 + uVar20 + 0x1e);
            if ((flags >> 8 & 1) == 0) {
              if (__n == 0) {
                bVar24 = false;
              }
              else {
                lVar10 = 0;
                do {
                  bVar2 = pComment[lVar10];
                  iVar19 = bVar2 + 0x20;
                  if (0x19 < (byte)(bVar2 + 0xbf)) {
                    iVar19 = (int)(char)bVar2;
                  }
                  bVar2 = *(byte *)((long)pvVar5 + lVar10 + uVar16 + uVar20 + uVar9 + 0x2e);
                  iVar17 = bVar2 + 0x20;
                  if (0x19 < (byte)(bVar2 + 0xbf)) {
                    iVar17 = (int)(char)bVar2;
                  }
                  bVar24 = iVar19 != iVar17;
                } while ((!bVar24) && (bVar25 = __n - 1 != lVar10, lVar10 = lVar10 + 1, bVar25));
              }
            }
            else {
              iVar19 = bcmp(pComment,(void *)((long)__s2 + uVar9 + uVar16),__n);
              bVar24 = iVar19 != 0;
            }
            bVar24 = (bool)(bVar24 ^ 1);
          }
          else {
            bVar24 = false;
          }
          bVar25 = false;
          if (!bVar24) goto LAB_0011af84;
        }
        if (((flags >> 9 & 1) != 0) && (uVar3 != 0)) {
          do {
            uVar11 = *(byte *)((long)pvVar5 + uVar9 + uVar20 + 0x2d) - 0x2f;
            if ((uVar11 < 0x2e) && ((0x200000000801U >> ((ulong)uVar11 & 0x3f) & 1) != 0))
            goto LAB_0011ae99;
            bVar25 = 1 < (long)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar25);
          uVar9 = 0;
LAB_0011ae99:
          __s2 = (void *)((long)__s2 + (uVar9 & 0xffffffff));
          uVar9 = (ulong)((uint)uVar3 - (int)uVar9);
        }
        bVar25 = false;
        if (sVar7 == uVar9) {
          if ((flags >> 8 & 1) == 0) {
            if (uVar9 == 0) {
              bVar24 = false;
            }
            else {
              lVar10 = 0;
              do {
                bVar2 = pName[lVar10];
                iVar19 = bVar2 + 0x20;
                if (0x19 < (byte)(bVar2 + 0xbf)) {
                  iVar19 = (int)(char)bVar2;
                }
                bVar2 = *(byte *)((long)__s2 + lVar10);
                iVar17 = bVar2 + 0x20;
                if (0x19 < (byte)(bVar2 + 0xbf)) {
                  iVar17 = (int)(char)bVar2;
                }
                bVar24 = iVar19 != iVar17;
              } while ((!bVar24) && (bVar25 = uVar9 - 1 != lVar10, lVar10 = lVar10 + 1, bVar25));
            }
          }
          else {
            iVar19 = bcmp(pName,__s2,uVar9);
            bVar24 = iVar19 != 0;
          }
          bVar25 = (bool)(bVar24 ^ 1);
          if ((pIndex != (mz_uint32 *)0x0) && (!bVar24)) {
            *pIndex = (mz_uint32)uVar12;
            bVar25 = true;
          }
        }
      }
LAB_0011af84:
      if (bVar25) {
        return 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < pZip->m_total_files);
  }
  mVar14 = MZ_ZIP_FILE_NOT_FOUND;
LAB_0011af9c:
  pZip->m_last_error = mVar14;
  return 0;
}

Assistant:

inline mz_bool
mz_zip_reader_locate_file_v2(mz_zip_archive* pZip, const char* pName, const char* pComment, mz_uint flags,
                             mz_uint32* pIndex) {

    mz_uint file_index;
    size_t name_len, comment_len;

    if (pIndex)
        *pIndex = 0;

    if ((!pZip) || (!pZip->m_pState) || (!pName))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* See if we can use a binary search */
    if (((pZip->m_pState->m_init_flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0)
            && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)
            && ((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) && (!pComment)
            && (pZip->m_pState->m_sorted_central_dir_offsets.m_size)) {
        return mz_zip_locate_file_binary_search(pZip, pName, pIndex);
    }

    /* Locate the entry by scanning the entire central directory */
    name_len = strlen(pName);
    if (name_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    comment_len = pComment ? strlen(pComment) : 0;
    if (comment_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    for (file_index = 0; file_index < pZip->m_total_files; file_index++) {
        const mz_uint8* pHeader = &MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir,
                                                        mz_uint8,
                                                        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets,
                                                                             mz_uint32,
                                                                             file_index));
        mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
        const char* pFilename = (const char*)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
        if (filename_len < name_len)
            continue;
        if (comment_len) {
            mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS), file_comment_len = MZ_READ_LE16(
                    pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
            const char* pFile_comment = pFilename + filename_len + file_extra_len;
            if ((file_comment_len != comment_len)
                    || (!mz_zip_string_equal(pComment, pFile_comment, file_comment_len, flags)))
                continue;
        }
        if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len)) {
            int ofs = filename_len - 1;
            do {
                if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') || (pFilename[ofs] == ':'))
                    break;
            } while (--ofs >= 0);
            ofs++;
            pFilename += ofs;
            filename_len -= ofs;
        }
        if ((filename_len == name_len) && (mz_zip_string_equal(pName, pFilename, filename_len, flags))) {
            if (pIndex)
                *pIndex = file_index;
            return MZ_TRUE;
        }
    }

    return mz_zip_set_error(pZip, MZ_ZIP_FILE_NOT_FOUND);
}